

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

mat4 * mat4_inverse(mat4 m)

{
  mat4 *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float in_stack_00000008;
  float in_stack_0000000c;
  float in_stack_00000010;
  float in_stack_00000014;
  float in_stack_00000018;
  float in_stack_0000001c;
  float in_stack_00000020;
  float in_stack_00000024;
  float in_stack_00000028;
  float in_stack_0000002c;
  float in_stack_00000030;
  float in_stack_00000034;
  float in_stack_00000038;
  float in_stack_0000003c;
  float in_stack_00000040;
  float in_stack_00000044;
  
  fVar4 = in_stack_00000008 * in_stack_0000001c;
  fVar1 = in_stack_00000008 * in_stack_00000020;
  fVar2 = in_stack_00000008 * in_stack_00000024;
  fVar11 = in_stack_0000000c * in_stack_00000018;
  fVar3 = in_stack_00000020 * in_stack_0000000c;
  fVar7 = in_stack_00000024 * in_stack_0000000c;
  fVar6 = in_stack_00000018 * in_stack_00000010;
  fVar9 = in_stack_0000001c * in_stack_00000010;
  fVar8 = in_stack_00000024 * in_stack_00000010;
  fVar5 = in_stack_00000018 * in_stack_00000014;
  fVar13 = in_stack_0000001c * in_stack_00000014;
  fVar10 = in_stack_00000020 * in_stack_00000014;
  fVar12 = ((((((((((((in_stack_0000002c * fVar10 * in_stack_00000038 +
                      in_stack_00000028 * fVar13 * in_stack_00000040 +
                      in_stack_00000030 * fVar5 * in_stack_0000003c +
                      in_stack_00000028 * fVar8 * in_stack_0000003c +
                      in_stack_00000034 * fVar9 * in_stack_00000038 +
                      in_stack_0000002c * fVar6 * in_stack_00000044 +
                      in_stack_00000030 * fVar7 * in_stack_00000038 +
                      fVar3 * in_stack_00000028 * in_stack_00000044 +
                      in_stack_00000034 * fVar11 * in_stack_00000040 +
                      fVar2 * in_stack_0000002c * in_stack_00000040 +
                      fVar4 * in_stack_00000030 * in_stack_00000044 +
                      fVar1 * in_stack_00000034 * in_stack_0000003c) -
                     in_stack_00000034 * fVar4 * in_stack_00000040) -
                    in_stack_0000002c * fVar1 * in_stack_00000044) -
                   in_stack_00000030 * fVar2 * in_stack_0000003c) -
                  in_stack_00000030 * fVar11 * in_stack_00000044) -
                 in_stack_00000034 * fVar3 * in_stack_00000038) -
                in_stack_00000028 * fVar7 * in_stack_00000040) -
               in_stack_00000034 * fVar6 * in_stack_0000003c) -
              in_stack_00000028 * fVar9 * in_stack_00000044) -
             in_stack_0000002c * fVar8 * in_stack_00000038) -
            in_stack_0000002c * fVar5 * in_stack_00000040) -
           in_stack_00000030 * fVar13 * in_stack_00000038) -
           in_stack_00000028 * fVar10 * in_stack_0000003c;
  if ((fVar12 != 0.0) || (NAN(fVar12))) {
    in_RDI->m[0] = ((((in_stack_00000024 * in_stack_0000002c * in_stack_00000040 +
                      in_stack_0000001c * in_stack_00000030 * in_stack_00000044 +
                      in_stack_00000020 * in_stack_00000034 * in_stack_0000003c) -
                     in_stack_0000001c * in_stack_00000034 * in_stack_00000040) -
                    in_stack_00000020 * in_stack_0000002c * in_stack_00000044) -
                   in_stack_00000030 * in_stack_00000024 * in_stack_0000003c) / fVar12;
    in_RDI->m[1] = ((((in_stack_00000030 * in_stack_00000014 * in_stack_0000003c +
                      in_stack_00000034 * in_stack_0000000c * in_stack_00000040 +
                      in_stack_00000044 * in_stack_0000002c * in_stack_00000010) -
                     in_stack_00000030 * in_stack_0000000c * in_stack_00000044) -
                    in_stack_00000034 * in_stack_00000010 * in_stack_0000003c) -
                   in_stack_0000002c * in_stack_00000014 * in_stack_00000040) / fVar12;
    in_RDI->m[2] = (-fVar10 * in_stack_0000003c +
                   -fVar9 * in_stack_00000044 +
                   -fVar7 * in_stack_00000040 +
                   fVar13 * in_stack_00000040 +
                   fVar3 * in_stack_00000044 + fVar8 * in_stack_0000003c) / fVar12;
    in_RDI->m[3] = (-fVar13 * in_stack_00000030 +
                   -fVar8 * in_stack_0000002c +
                   -fVar3 * in_stack_00000034 +
                   in_stack_0000002c * fVar10 +
                   in_stack_00000030 * fVar7 + in_stack_00000034 * fVar9) / fVar12;
    in_RDI->m[4] = ((((in_stack_00000030 * in_stack_00000024 * in_stack_00000038 +
                      in_stack_00000034 * in_stack_00000018 * in_stack_00000040 +
                      in_stack_00000044 * in_stack_00000020 * in_stack_00000028) -
                     in_stack_00000030 * in_stack_00000018 * in_stack_00000044) -
                    in_stack_00000020 * in_stack_00000034 * in_stack_00000038) -
                   in_stack_00000024 * in_stack_00000028 * in_stack_00000040) / fVar12;
    in_RDI->m[5] = ((((in_stack_00000014 * in_stack_00000028 * in_stack_00000040 +
                      in_stack_00000008 * in_stack_00000030 * in_stack_00000044 +
                      in_stack_00000034 * in_stack_00000010 * in_stack_00000038) -
                     in_stack_00000008 * in_stack_00000034 * in_stack_00000040) -
                    in_stack_00000010 * in_stack_00000028 * in_stack_00000044) -
                   in_stack_00000030 * in_stack_00000014 * in_stack_00000038) / fVar12;
    in_RDI->m[6] = (-fVar5 * in_stack_00000040 +
                   -fVar8 * in_stack_00000038 +
                   -fVar1 * in_stack_00000044 +
                   fVar10 * in_stack_00000038 +
                   fVar2 * in_stack_00000040 + fVar6 * in_stack_00000044) / fVar12;
    in_RDI->m[7] = (-fVar10 * in_stack_00000028 +
                   -fVar6 * in_stack_00000034 +
                   -fVar2 * in_stack_00000030 +
                   in_stack_00000030 * fVar5 + fVar1 * in_stack_00000034 + in_stack_00000028 * fVar8
                   ) / fVar12;
    in_RDI->m[8] = ((((in_stack_00000024 * in_stack_00000028 * in_stack_0000003c +
                      in_stack_00000018 * in_stack_0000002c * in_stack_00000044 +
                      in_stack_0000001c * in_stack_00000034 * in_stack_00000038) -
                     in_stack_00000034 * in_stack_00000018 * in_stack_0000003c) -
                    in_stack_0000001c * in_stack_00000028 * in_stack_00000044) -
                   in_stack_00000024 * in_stack_0000002c * in_stack_00000038) / fVar12;
    in_RDI->m[9] = ((((in_stack_0000002c * in_stack_00000014 * in_stack_00000038 +
                      in_stack_00000008 * in_stack_00000034 * in_stack_0000003c +
                      in_stack_00000044 * in_stack_0000000c * in_stack_00000028) -
                     in_stack_00000008 * in_stack_0000002c * in_stack_00000044) -
                    in_stack_00000034 * in_stack_0000000c * in_stack_00000038) -
                   in_stack_00000014 * in_stack_00000028 * in_stack_0000003c) / fVar12;
    in_RDI->m[10] =
         (-fVar13 * in_stack_00000038 +
         in_stack_00000044 * -fVar11 +
         -fVar2 * in_stack_0000003c +
         fVar5 * in_stack_0000003c + fVar4 * in_stack_00000044 + fVar7 * in_stack_00000038) / fVar12
    ;
    in_RDI->m[0xb] =
         (-fVar5 * in_stack_0000002c +
         -fVar7 * in_stack_00000028 +
         in_stack_00000034 * -fVar4 +
         in_stack_00000028 * fVar13 + fVar2 * in_stack_0000002c + in_stack_00000034 * fVar11) /
         fVar12;
    in_RDI->m[0xc] =
         ((((in_stack_00000020 * in_stack_0000002c * in_stack_00000038 +
            in_stack_00000030 * in_stack_00000018 * in_stack_0000003c +
            in_stack_0000001c * in_stack_00000028 * in_stack_00000040) -
           in_stack_00000018 * in_stack_0000002c * in_stack_00000040) -
          in_stack_0000001c * in_stack_00000030 * in_stack_00000038) -
         in_stack_00000020 * in_stack_00000028 * in_stack_0000003c) / fVar12;
    in_RDI->m[0xd] =
         ((((in_stack_00000010 * in_stack_00000028 * in_stack_0000003c +
            in_stack_00000008 * in_stack_0000002c * in_stack_00000040 +
            in_stack_00000030 * in_stack_0000000c * in_stack_00000038) -
           in_stack_00000008 * in_stack_00000030 * in_stack_0000003c) -
          in_stack_0000000c * in_stack_00000028 * in_stack_00000040) -
         in_stack_0000002c * in_stack_00000010 * in_stack_00000038) / fVar12;
    in_RDI->m[0xe] =
         (-fVar6 * in_stack_0000003c +
         -fVar3 * in_stack_00000038 +
         -fVar4 * in_stack_00000040 +
         fVar9 * in_stack_00000038 + fVar1 * in_stack_0000003c + fVar11 * in_stack_00000040) /
         fVar12;
    in_RDI->m[0xf] =
         (-fVar9 * in_stack_00000028 +
         -fVar11 * in_stack_00000030 +
         -fVar1 * in_stack_0000002c +
         in_stack_0000002c * fVar6 + fVar4 * in_stack_00000030 + fVar3 * in_stack_00000028) / fVar12
    ;
  }
  else {
    in_RDI->m[0] = 1.0;
    in_RDI->m[1] = 0.0;
    in_RDI->m[2] = 0.0;
    in_RDI->m[3] = 0.0;
    in_RDI->m[4] = 0.0;
    in_RDI->m[5] = 1.0;
    in_RDI->m[6] = 0.0;
    in_RDI->m[7] = 0.0;
    in_RDI->m[8] = 0.0;
    in_RDI->m[9] = 0.0;
    in_RDI->m[10] = 1.0;
    in_RDI->m[0xb] = 0.0;
    in_RDI->m[0xc] = 0.0;
    in_RDI->m[0xd] = 0.0;
    in_RDI->m[0xe] = 0.0;
    in_RDI->m[0xf] = 1.0;
  }
  return in_RDI;
}

Assistant:

mat4 mat4_inverse(mat4 m) {
    float *a = m.m;

    float det =
        a[0] * a[5] * a[10] * a[15] +
        a[0] * a[6] * a[11] * a[13] +
        a[0] * a[7] * a[9] * a[14] +

        a[1] * a[4] * a[11] * a[14] +
        a[1] * a[6] * a[8] * a[15] +
        a[1] * a[7] * a[10] * a[12] +

        a[2] * a[4] * a[9] * a[15] +
        a[2] * a[5] * a[11] * a[12] +
        a[2] * a[7] * a[8] * a[13] +

        a[3] * a[4] * a[10] * a[13] +
        a[3] * a[5] * a[8] * a[14] +
        a[3] * a[6] * a[9] * a[12] -

        a[0] * a[5] * a[11] * a[14] -
        a[0] * a[6] * a[9] * a[15] -
        a[0] * a[7] * a[10] * a[13] -

        a[1] * a[4] * a[10] * a[15] -
        a[1] * a[6] * a[11] * a[12] -
        a[1] * a[7] * a[8] * a[14] -

        a[2] * a[4] * a[11] * a[13] -
        a[2] * a[5] * a[8] * a[15] -
        a[2] * a[7] * a[9] * a[12] -

        a[3] * a[4] * a[9] * a[14] -
        a[3] * a[5] * a[10] * a[12] -
        a[3] * a[6] * a[8] * a[13];

    if (det == 0.0) {
        return mat4_identity();
    }

    float a0 = a[5] * a[10] * a[15] + a[6] * a[11] * a[13] + a[7] * a[9] * a[14] - a[5] * a[11] * a[14] - a[6] * a[9] * a[15] - a[7] * a[10] * a[13];

    float a1 = a[1] * a[11] * a[14] + a[2] * a[9] * a[15] + a[3] * a[10] * a[13] - a[1] * a[10] * a[15] - a[2] * a[11] * a[13] - a[3] * a[9] * a[14];

    float a2 = a[1] * a[6] * a[15] + a[2] * a[7] * a[13] + a[3] * a[5] * a[14] - a[1] * a[7] * a[14] - a[2] * a[5] * a[15] - a[3] * a[6] * a[13];

    float a3 = a[1] * a[7] * a[10] + a[2] * a[5] * a[11] + a[3] * a[6] * a[9] - a[1] * a[6] * a[11] - a[2] * a[7] * a[9] - a[3] * a[5] * a[10];

    float a4 = a[4] * a[11] * a[14] + a[6] * a[8] * a[15] + a[7] * a[10] * a[12] - a[4] * a[10] * a[15] - a[6] * a[11] * a[12] - a[7] * a[8] * a[14];

    float a5 = a[0] * a[10] * a[15] + a[2] * a[11] * a[12] + a[3] * a[8] * a[14] - a[0] * a[11] * a[14] - a[2] * a[8] * a[15] - a[3] * a[10] * a[12];

    float a6 = a[0] * a[7] * a[14] + a[2] * a[4] * a[15] + a[3] * a[6] * a[12] - a[0] * a[6] * a[15] - a[2] * a[7] * a[12] - a[3] * a[4] * a[14];

    float a7 = a[0] * a[6] * a[11] + a[2] * a[7] * a[8] + a[3] * a[4] * a[10] - a[0] * a[7] * a[10] - a[2] * a[4] * a[11] - a[3] * a[6] * a[8];

    float a8 = a[4] * a[9] * a[15] + a[5] * a[11] * a[12] + a[7] * a[8] * a[13] - a[4] * a[11] * a[13] - a[5] * a[8] * a[15] - a[7] * a[9] * a[12];

    float a9 = a[0] * a[11] * a[13] + a[1] * a[8] * a[15] + a[3] * a[9] * a[12] - a[0] * a[9] * a[15] - a[1] * a[11] * a[12] - a[3] * a[8] * a[13];

    float a10 = a[0] * a[5] * a[15] + a[1] * a[7] * a[12] + a[3] * a[4] * a[13] - a[0] * a[7] * a[13] - a[1] * a[4] * a[15] - a[3] * a[5] * a[12];

    float a11 = a[0] * a[7] * a[9] + a[1] * a[4] * a[11] + a[3] * a[5] * a[8] - a[0] * a[5] * a[11] - a[1] * a[7] * a[8] - a[3] * a[4] * a[9];

    float a12 = a[4] * a[10] * a[13] + a[5] * a[8] * a[14] + a[6] * a[9] * a[12] - a[4] * a[9] * a[14] - a[5] * a[10] * a[12] - a[6] * a[8] * a[13];

    float a13 = a[0] * a[9] * a[14] + a[1] * a[10] * a[12] + a[2] * a[8] * a[13] - a[0] * a[10] * a[13] - a[1] * a[8] * a[14] - a[2] * a[9] * a[12];

    float a14 = a[0] * a[6] * a[13] + a[1] * a[4] * a[14] + a[2] * a[5] * a[12] - a[0] * a[5] * a[14] - a[1] * a[6] * a[12] - a[2] * a[4] * a[13];

    float a15 = a[0] * a[5] * a[10] + a[1] * a[6] * a[8] + a[2] * a[4] * a[9] - a[0] * a[6] * a[9] - a[1] * a[4] * a[10] - a[2] * a[5] * a[8];

    return mat4_create(
            a0 / det, a1 / det, a2 / det, a3 / det,
            a4 / det, a5 / det, a6 / det, a7 / det,
            a8 / det, a9 / det, a10 / det, a11 / det,
            a12 / det, a13 / det, a14 / det, a15 / det);
}